

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O1

int kftp_get_response(knetFile *ftp)

{
  ushort *puVar1;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uchar c;
  char *p;
  char local_39;
  char *local_38;
  
  iVar2 = socket_wait(ftp->ctrl_fd,1);
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  else {
    sVar3 = read(ftp->ctrl_fd,&local_39,1);
    if (sVar3 == 0) {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      do {
        iVar2 = ftp->max_response;
        if (iVar2 <= (int)uVar8) {
          iVar7 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar7 = 0x100;
          }
          ftp->max_response = iVar7;
          pcVar4 = (char *)realloc(ftp->response,(long)iVar7);
          ftp->response = pcVar4;
        }
        ftp->response[(int)uVar8] = local_39;
        uVar9 = uVar8 + 1;
        if (local_39 == '\n') {
          uVar9 = 0;
          if (2 < (int)uVar8) {
            ppuVar5 = __ctype_b_loc();
            puVar1 = *ppuVar5;
            pcVar4 = ftp->response;
            if (((((*(byte *)((long)puVar1 + (long)*pcVar4 * 2 + 1) & 8) != 0) &&
                 ((*(byte *)((long)puVar1 + (long)pcVar4[1] * 2 + 1) & 8) != 0)) &&
                (uVar9 = 0, (*(byte *)((long)puVar1 + (long)pcVar4[2] * 2 + 1) & 8) != 0)) &&
               (uVar8 = uVar8 + 1, pcVar4[3] != '-')) break;
          }
        }
        uVar8 = uVar9;
        sVar3 = read(ftp->ctrl_fd,&local_39,1);
      } while (sVar3 != 0);
    }
    iVar2 = -1;
    if (1 < (int)uVar8) {
      ftp->response[(ulong)uVar8 - 2] = '\0';
      lVar6 = strtol(ftp->response,&local_38,0);
      iVar2 = (int)lVar6;
    }
  }
  return iVar2;
}

Assistant:

static int kftp_get_response(knetFile *ftp)
{
#ifndef _WIN32
	unsigned char c;
#else
	char c;
#endif
	int n = 0;
	char *p;
	if (socket_wait(ftp->ctrl_fd, 1) <= 0) return 0;
	while (netread(ftp->ctrl_fd, &c, 1)) { // FIXME: this is *VERY BAD* for unbuffered I/O
		//fputc(c, stderr);
		if (n >= ftp->max_response) {
			ftp->max_response = ftp->max_response? ftp->max_response<<1 : 256;
			ftp->response = (char*)realloc(ftp->response, ftp->max_response);
		}
		ftp->response[n++] = c;
		if (c == '\n') {
			if (n >= 4 && isdigit(ftp->response[0]) && isdigit(ftp->response[1]) && isdigit(ftp->response[2])
				&& ftp->response[3] != '-') break;
			n = 0;
			continue;
		}
	}
	if (n < 2) return -1;
	ftp->response[n-2] = 0;
	return strtol(ftp->response, &p, 0);
}